

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::find_lsb
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  string shaderSource_00;
  bool bVar1;
  char *__s;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  DataType in_R9D;
  long lVar4;
  string shaderSource;
  undefined1 in_stack_ffffffffffffff58 [16];
  _Alloc_hider _Var5;
  size_type sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  long *local_78 [2];
  long local_68 [2];
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  _Var5._M_p = (pointer)&local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff68,"findLSB: Invalid value type.","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != &local_88) {
    operator_delete(_Var5._M_p,local_88._M_allocated_capacity + 1);
  }
  lVar4 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar4];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_50,__s,(allocator<char> *)&stack0xffffffffffffff67);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1c79853);
      _Var5._M_p = (pointer)&local_88;
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar3) {
        local_88._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_88._8_8_ = plVar2[3];
      }
      else {
        local_88._M_allocated_capacity = paVar3->_M_allocated_capacity;
        _Var5._M_p = (pointer)*plVar2;
      }
      sVar6 = plVar2[1];
      *plVar2 = (long)paVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff68);
      local_58 = lVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var5._M_p != &local_88) {
        operator_delete(_Var5._M_p,local_88._M_allocated_capacity + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar4 = 0;
      do {
        NegativeTestShared::(anonymous_namespace)::genShaderSourceReverseCountFind_abi_cxx11_
                  ((string *)&stack0xffffffffffffff68,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_TESSELLATION_CONTROL,
                   *(ShaderFunction *)
                    ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes + lVar4
                    ),in_R9D);
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char*>((string *)local_78,_Var5._M_p,_Var5._M_p + sVar6);
        shaderSource_00.field_2._M_allocated_capacity = (size_type)_Var5._M_p;
        shaderSource_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff58._0_8_;
        shaderSource_00._M_string_length = in_stack_ffffffffffffff58._8_8_;
        shaderSource_00.field_2._8_8_ = sVar6;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_78[0],shaderSource_00);
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var5._M_p != &local_88) {
          operator_delete(_Var5._M_p,local_88._M_allocated_capacity + 1);
        }
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      NegativeTestContext::endSection(ctx);
      lVar4 = local_58;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void find_lsb (NegativeTestContext& ctx)
{
	ctx.beginSection("findLSB: Invalid value type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				const std::string shaderSource(genShaderSourceReverseCountFind(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_FIND_LSB, s_floatTypes[dataTypeNdx]));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}